

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::getdashorder(Forth *this)

{
  bool bVar1;
  size_type sVar2;
  uint *puVar3;
  iterator iStack_28;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  Forth *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->searchOrder);
  requireDStackAvailable(this,sVar2 + 1,"GET-ORDER");
  __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->searchOrder);
  iStack_28 = std::vector<int,_std::allocator<int>_>::end(&this->searchOrder);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&__end2,&stack0xffffffffffffffd8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end2);
    ForthStack<unsigned_int>::push(&this->dStack,*puVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->searchOrder);
  ForthStack<unsigned_int>::push(&this->dStack,(uint)sVar2);
  return;
}

Assistant:

void getdashorder(){
			REQUIRE_DSTACK_AVAILABLE(searchOrder.size()+1, "GET-ORDER");
			for(auto i : searchOrder ){
				dStack.push(i); 
			}
			dStack.push(CELL(searchOrder.size())); 
		}